

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.cpp
# Opt level: O0

Sexp * __thiscall GcHeap::GcHeapImpl::Forward(GcHeapImpl *this,Sexp *ptr)

{
  mapped_type *ppSVar1;
  mapped_type local_20;
  Sexp *to_ref;
  Sexp *ptr_local;
  GcHeapImpl *this_local;
  
  to_ref = ptr;
  ptr_local = (Sexp *)this;
  ppSVar1 = std::
            unordered_map<Sexp_*,_Sexp_*,_std::hash<Sexp_*>,_std::equal_to<Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>_>
            ::operator[](&this->forwarding_addresses,&to_ref);
  local_20 = *ppSVar1;
  if (local_20 == (mapped_type)0x0) {
    local_20 = Copy(this,to_ref);
  }
  if (local_20 != (mapped_type)0x0) {
    return local_20;
  }
  __assert_fail("to_ref != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                ,0x149,"Sexp *GcHeap::GcHeapImpl::Forward(Sexp *)");
}

Assistant:

Sexp *Forward(Sexp *ptr) {
    Sexp *to_ref = forwarding_addresses[ptr];
    if (to_ref == nullptr) {
      // this reference hasn't been copied yet. do it.
      to_ref = Copy(ptr);
    }

    // DebugLog("processed value: %s", to_ref->DumpString().c_str());
    assert(to_ref != nullptr);
    return to_ref;
  }